

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void google::protobuf::PlanAllocationSize
               (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *services,
               size_t parent_scope_size,FlatAllocator *alloc)

{
  bool bVar1;
  int array_size;
  reference this;
  long lVar2;
  RepeatedPtrField<google::protobuf::MethodDescriptorProto> *methods;
  size_t local_58;
  size_t full_name_size;
  ServiceDescriptorProto *service;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *__range2;
  FlatAllocator *alloc_local;
  size_t parent_scope_size_local;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *services_local;
  
  array_size = RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::size(services);
  anon_unknown_24::
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ::PlanArray<google::protobuf::ServiceDescriptor>
            (&alloc->
              super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ,array_size);
  __end2 = RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::begin(services);
  service = (ServiceDescriptorProto *)
            RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::end(services);
  while (bVar1 = internal::operator!=(&__end2,(iterator *)&service), bVar1) {
    this = internal::RepeatedPtrIterator<const_google::protobuf::ServiceDescriptorProto>::operator*
                     (&__end2);
    bVar1 = ServiceDescriptorProto::has_options(this);
    if (bVar1) {
      anon_unknown_24::
      FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ::PlanArray<google::protobuf::ServiceOptions>
                (&alloc->
                  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                 ,1);
    }
    if (parent_scope_size == 0) {
      ServiceDescriptorProto::name_abi_cxx11_(this);
      local_58 = std::__cxx11::string::size();
    }
    else {
      ServiceDescriptorProto::name_abi_cxx11_(this);
      lVar2 = std::__cxx11::string::size();
      local_58 = parent_scope_size + 1 + lVar2;
    }
    anon_unknown_24::
    FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ::PlanEntityNames(&alloc->
                       super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                      ,local_58);
    methods = ServiceDescriptorProto::method(this);
    PlanAllocationSize(methods,local_58,alloc);
    internal::RepeatedPtrIterator<const_google::protobuf::ServiceDescriptorProto>::operator++
              (&__end2);
  }
  return;
}

Assistant:

static void PlanAllocationSize(
    const RepeatedPtrField<ServiceDescriptorProto>& services,
    size_t parent_scope_size, internal::FlatAllocator& alloc) {
  alloc.PlanArray<ServiceDescriptor>(services.size());
  for (const auto& service : services) {
    if (service.has_options()) alloc.PlanArray<ServiceOptions>(1);
    const size_t full_name_size =
        parent_scope_size ? parent_scope_size + 1 + service.name().size()
                          : service.name().size();
    alloc.PlanEntityNames(full_name_size);
    PlanAllocationSize(service.method(), full_name_size, alloc);
  }
}